

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf_v3.cxx
# Opt level: O0

void __thiscall xray_re::xr_ogf_v3::load_child_refs(xr_ogf_v3 *this,xr_reader *r)

{
  uint_fast32_t this_00;
  bool bVar1;
  uint32_t uVar2;
  xr_reader *pxVar3;
  xr_ogf_v3 *this_01;
  xr_ogf_v3 *local_b0;
  xr_ogf_v3 *local_a8;
  xr_ogf_v3 *ogf;
  xr_reader *local_80;
  xr_reader *s;
  uint_fast32_t n;
  xr_file_system *fs;
  undefined1 local_58 [8];
  string name;
  string folder;
  xr_reader *r_local;
  xr_ogf_v3 *this_local;
  
  bVar1 = std::vector<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>::empty
                    (&(this->super_xr_ogf).m_children);
  if (bVar1) {
    std::__cxx11::string::string((string *)(name.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)local_58);
    xr_file_system::split_path
              (&(this->super_xr_ogf).m_path,(string *)(name.field_2._M_local_buf + 8),(string *)0x0,
               (string *)0x0);
    n = (uint_fast32_t)xr_file_system::instance();
    uVar2 = xr_reader::r_u32(r);
    for (s = (xr_reader *)(ulong)uVar2; s != (xr_reader *)0x0;
        s = (xr_reader *)((long)&s[-1].m_next + 7)) {
      xr_reader::r_sz(r,(string *)local_58);
      this_00 = n;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ogf,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&name.field_2 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
      pxVar3 = xr_file_system::r_open((xr_file_system *)this_00,(string *)&ogf);
      std::__cxx11::string::~string((string *)&ogf);
      local_80 = pxVar3;
      if (pxVar3 != (xr_reader *)0x0) {
        this_01 = (xr_ogf_v3 *)operator_new(0x770);
        xr_ogf_v3(this_01);
        local_a8 = this_01;
        (*(this_01->super_xr_ogf).super_xr_object.super_xr_surface_factory._vptr_xr_surface_factory
          [0x15])(this_01,local_80);
        local_b0 = local_a8;
        std::vector<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>::push_back
                  (&(this->super_xr_ogf).m_children,(value_type *)&local_b0);
        xr_file_system::r_close((xr_file_system *)n,&local_80);
      }
    }
    xr_ogf::set_chunk_loaded(&this->super_xr_ogf,5);
    std::__cxx11::string::~string((string *)local_58);
    std::__cxx11::string::~string((string *)(name.field_2._M_local_buf + 8));
    return;
  }
  __assert_fail("m_children.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ogf_v3.cxx"
                ,0x8f,"void xray_re::xr_ogf_v3::load_child_refs(xr_reader &)");
}

Assistant:

void xr_ogf_v3::load_child_refs(xr_reader& r)
{
	assert(m_children.empty());
	std::string folder, name;
	xr_file_system::split_path(m_path, &folder);
	xr_file_system& fs = xr_file_system::instance();
	for (uint_fast32_t n = r.r_u32(); n; --n) {
		r.r_sz(name);
		xr_reader* s = fs.r_open(folder + name);
		if (!s)
			continue;
		xr_ogf_v3* ogf = new xr_ogf_v3;
		ogf->load_ogf(*s);
		m_children.push_back(ogf);
		fs.r_close(s);
	}
	set_chunk_loaded(OGF3_CHILD_REFS);
}